

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O3

char * vstrdupf(char *fmt,__va_list_tag *args)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  va_list args2;
  __va_list_tag _Stack_130;
  undefined1 auStack_110 [8];
  undefined8 uStack_108;
  undefined1 *puStack_f8;
  __va_list_tag *p_Stack_58;
  char *pcStack_50;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  puVar6 = &local_38;
  local_28 = args->reg_save_area;
  local_38._0_4_ = args->gp_offset;
  local_38._4_4_ = args->fp_offset;
  pvStack_30 = args->overflow_arg_area;
  pcVar9 = "";
  if (fmt != (char *)0x0) {
    pcVar9 = fmt;
  }
  uVar7 = 0;
  iVar4 = vsnprintf((char *)0x0,0,pcVar9,&local_38);
  pcVar8 = (char *)(long)(iVar4 + 2);
  pcVar5 = (char *)malloc((size_t)pcVar8);
  if (pcVar5 != (char *)0x0) {
    vsprintf(pcVar5,pcVar9,args);
    return pcVar5;
  }
  vstrdupf_cold_1();
  _Stack_130.reg_save_area = auStack_110;
  _Stack_130.overflow_arg_area = &pvStack_30;
  _Stack_130.gp_offset = 8;
  _Stack_130.fp_offset = 0x30;
  if (pcVar8 != (char *)0x0) {
    uStack_108 = uVar7;
    puStack_f8 = (undefined1 *)puVar6;
    p_Stack_58 = args;
    pcStack_50 = pcVar9;
    pcVar8 = vstrdupf(pcVar8,&_Stack_130);
    cVar1 = *pcVar8;
    pcVar9 = pcVar8;
    pcVar5 = pcVar8;
    while (pcVar3 = pcVar5, cVar1 != '\0') {
      pcVar5 = pcVar3 + 1;
      cVar2 = *pcVar3;
      if ((cVar2 == '\n') || (cVar2 == '\0')) {
        *pcVar3 = '\0';
        printf("# %s\n",pcVar9);
        if (cVar2 == '\0') break;
        *pcVar3 = cVar2;
        cVar1 = *pcVar5;
        pcVar9 = pcVar5;
      }
    }
    free(pcVar8);
  }
  return (char *)0x0;
}

Assistant:

static char *
vstrdupf (const char *fmt, va_list args) {
    char *str;
    int size;
    va_list args2;
    va_copy(args2, args);
    if (!fmt)
        fmt = "";
    size = vsnprintf(NULL, 0, fmt, args2) + 2;
    str = malloc(size);
    if (!str) {
        perror("malloc error");
        exit(1);
    }
    vsprintf(str, fmt, args);
    va_end(args2);
    return str;
}